

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_suite.hpp
# Opt level: O3

bool __thiscall iutest::TestSuite::Passed(TestSuite *this)

{
  pointer ppTVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  pointer ppTVar5;
  
  if (this->m_should_run_num != 0) {
    ppTVar5 = (this->m_testinfos).
              super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppTVar1 = (this->m_testinfos).
              super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppTVar5 != ppTVar1) {
      iVar4 = 0;
      do {
        uVar3 = 0;
        if ((*ppTVar5)->m_should_run == true) {
          bVar2 = TestResult::Failed(&(*ppTVar5)->m_test_result);
          uVar3 = (uint)bVar2;
        }
        iVar4 = iVar4 + uVar3;
        ppTVar5 = ppTVar5 + 1;
      } while (ppTVar5 != ppTVar1);
      if (iVar4 != 0) {
        return false;
      }
    }
  }
  bVar2 = TestResult::Failed(&this->m_ad_hoc_testresult);
  return !bVar2;
}

Assistant:

bool            Passed()                const { return failed_test_count() == 0 && m_ad_hoc_testresult.Passed(); }